

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_set_sr_im(DisasContext_conflict2 *s,uint16_t val,int ccr_only)

{
  TCGContext_conflict2 *tcg_ctx;
  uint uVar1;
  uintptr_t o;
  TCGv_i32 pTVar2;
  TCGTemp *local_28;
  TCGTemp *local_20;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (ccr_only == 0) {
    pTVar2 = tcg_const_i32_m68k(tcg_ctx,(uint)val);
    local_28 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
    local_20 = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
    tcg_gen_callN_m68k(tcg_ctx,helper_set_sr_m68k,(TCGTemp *)0x0,2,&local_28);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  }
  else {
    uVar1 = (uint)val;
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_C + (long)tcg_ctx),
                     (ulong)(uVar1 & 1));
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_V + (long)tcg_ctx),
                     (long)((int)(uVar1 << 0x1e) >> 0x1f));
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_Z + (long)tcg_ctx),
                     (ulong)((val & 4) == 0));
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_N + (long)tcg_ctx),
                     (long)((int)(uVar1 << 0x1c) >> 0x1f));
    tcg_gen_op2_m68k(tcg_ctx,INDEX_op_movi_i32,(TCGArg)(QREG_CC_X + (long)tcg_ctx),
                     (ulong)(val >> 4 & 1));
  }
  set_cc_op(s,CC_OP_FLAGS);
  return;
}

Assistant:

static void gen_set_sr_im(DisasContext *s, uint16_t val, int ccr_only)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (ccr_only) {
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_C, val & CCF_C ? 1 : 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_V, val & CCF_V ? -1 : 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_Z, val & CCF_Z ? 0 : 1);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_N, val & CCF_N ? -1 : 0);
        tcg_gen_movi_i32(tcg_ctx, QREG_CC_X, val & CCF_X ? 1 : 0);
    } else {
        TCGv sr = tcg_const_i32(tcg_ctx, val);
        gen_helper_set_sr(tcg_ctx, tcg_ctx->cpu_env, sr);
        tcg_temp_free(tcg_ctx, sr);
    }
    set_cc_op(s, CC_OP_FLAGS);
}